

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O0

void WebPSamplerProcessPlane
               (uint8_t *y,int y_stride,uint8_t *u,uint8_t *v,int uv_stride,uint8_t *dst,
               int dst_stride,int width,int height,WebPSamplerRowFunc func)

{
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  int j;
  undefined4 in_stack_00000010;
  undefined4 local_34;
  undefined8 local_30;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_8;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_34 = 0; (int)local_34 < (int)v; local_34 = local_34 + 1) {
    (*(code *)u)(local_8,local_18,local_20,local_30,in_stack_00000010);
    local_8 = local_8 + in_ESI;
    if ((local_34 & 1) != 0) {
      local_18 = local_18 + in_R8D;
      local_20 = local_20 + in_R8D;
    }
    local_30 = local_30 + (int)dst;
  }
  return;
}

Assistant:

void WebPSamplerProcessPlane(const uint8_t* y, int y_stride,
                             const uint8_t* u, const uint8_t* v, int uv_stride,
                             uint8_t* dst, int dst_stride,
                             int width, int height, WebPSamplerRowFunc func) {
  int j;
  for (j = 0; j < height; ++j) {
    func(y, u, v, dst, width);
    y += y_stride;
    if (j & 1) {
      u += uv_stride;
      v += uv_stride;
    }
    dst += dst_stride;
  }
}